

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

RegExp * re2c::mkAlt(RegExp *e1,RegExp *e2)

{
  MatchOp *e1_00;
  RegExp *pRVar1;
  MatchOp *local_90;
  MatchOp *local_80;
  long local_70;
  MatchOp *local_60;
  MatchOp *local_50;
  long local_40;
  MatchOp *local_30;
  MatchOp *m2;
  MatchOp *m1;
  AltOp *a;
  RegExp *e2_local;
  RegExp *e1_local;
  
  if (e1 == (RegExp *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = __dynamic_cast(e1,&RegExp::typeinfo,&AltOp::typeinfo,0);
  }
  e2_local = e1;
  if (local_40 == 0) {
    if (e1 == (RegExp *)0x0) {
      local_60 = (MatchOp *)0x0;
    }
    else {
      local_60 = (MatchOp *)__dynamic_cast(e1,&RegExp::typeinfo,&MatchOp::typeinfo,0);
    }
    m2 = local_60;
    if (local_60 != (MatchOp *)0x0) {
      e2_local = (RegExp *)0x0;
    }
  }
  else {
    if (*(long *)(local_40 + 8) == 0) {
      local_50 = (MatchOp *)0x0;
    }
    else {
      local_50 = (MatchOp *)
                 __dynamic_cast(*(long *)(local_40 + 8),&RegExp::typeinfo,&MatchOp::typeinfo,0);
    }
    m2 = local_50;
    if (local_50 != (MatchOp *)0x0) {
      e2_local = *(RegExp **)(local_40 + 0x10);
    }
  }
  if (e2 == (RegExp *)0x0) {
    local_70 = 0;
  }
  else {
    local_70 = __dynamic_cast(e2,&RegExp::typeinfo,&AltOp::typeinfo,0);
  }
  a = (AltOp *)e2;
  if (local_70 == 0) {
    if (e2 == (RegExp *)0x0) {
      local_90 = (MatchOp *)0x0;
    }
    else {
      local_90 = (MatchOp *)__dynamic_cast(e2,&RegExp::typeinfo,&MatchOp::typeinfo,0);
    }
    local_30 = local_90;
    if (local_90 != (MatchOp *)0x0) {
      a = (AltOp *)0x0;
    }
  }
  else {
    if (*(long *)(local_70 + 8) == 0) {
      local_80 = (MatchOp *)0x0;
    }
    else {
      local_80 = (MatchOp *)
                 __dynamic_cast(*(long *)(local_70 + 8),&RegExp::typeinfo,&MatchOp::typeinfo,0);
    }
    local_30 = local_80;
    if (local_80 != (MatchOp *)0x0) {
      a = *(AltOp **)(local_70 + 0x10);
    }
  }
  e1_00 = merge(m2,local_30);
  pRVar1 = doAlt(e2_local,&a->super_RegExp);
  pRVar1 = doAlt(&e1_00->super_RegExp,pRVar1);
  return pRVar1;
}

Assistant:

RegExp * mkAlt (RegExp * e1, RegExp * e2)
{
	AltOp * a;
	MatchOp * m1;
	MatchOp * m2;

	a = dynamic_cast<AltOp*> (e1);
	if (a != NULL)
	{
		m1 = dynamic_cast<MatchOp*> (a->exp1);
		if (m1 != NULL)
		{
			e1 = a->exp2;
		}
	}
	else
	{
		m1 = dynamic_cast<MatchOp*> (e1);
		if (m1 != NULL)
		{
			e1 = NULL;
		}
	}
	a = dynamic_cast<AltOp*> (e2);
	if (a != NULL)
	{
		m2 = dynamic_cast<MatchOp*> (a->exp1);
		if (m2 != NULL)
		{
			e2 = a->exp2;
		}
	}
	else
	{
		m2 = dynamic_cast<MatchOp*> (e2);
		if (m2 != NULL)
		{
			e2 = NULL;
		}
	}

	return doAlt (merge (m1, m2), doAlt (e1, e2));
}